

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# half.cpp
# Opt level: O0

short half::convert(int i)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint in_EDI;
  int b;
  int a;
  int t;
  int m;
  int e;
  int s;
  undefined4 local_14;
  undefined4 local_10;
  undefined2 local_2;
  
  local_2 = (ushort)(in_EDI >> 0x10) & 0x8000;
  uVar2 = (int)in_EDI >> 0x17 & 0xff;
  local_10 = uVar2 - 0x70;
  uVar3 = in_EDI & 0x7fffff;
  if (local_10 < 1) {
    if (-0xb < local_10) {
      bVar1 = -(char)local_10 + 0xe;
      local_2 = local_2 | (ushort)((int)((uVar3 | 0x800000) +
                                         (1 << (-(char)local_10 + 0xdU & 0x1f)) + -1 +
                                        ((int)(uVar3 | 0x800000) >> (bVar1 & 0x1f) & 1U)) >>
                                  (bVar1 & 0x1f));
    }
  }
  else {
    uVar4 = (int)uVar3 >> 0xd;
    if (local_10 == 0x8f) {
      if (uVar3 == 0) {
        local_2 = local_2 | 0x7c00;
      }
      else {
        local_2 = local_2 | 0x7c00 | (ushort)uVar4 | (ushort)(uVar4 == 0);
      }
    }
    else {
      local_14 = uVar3 + 0xfff + (uVar4 & 1);
      if ((local_14 & 0x800000) != 0) {
        local_14 = 0;
        local_10 = uVar2 - 0x6f;
      }
      if (local_10 < 0x1f) {
        local_2 = local_2 | (ushort)(local_10 << 10) | (ushort)((int)local_14 >> 0xd);
      }
      else {
        overflow();
        local_2 = local_2 | 0x7c00;
      }
    }
  }
  return local_2;
}

Assistant:

HALF_EXPORT short
half::convert (int i)
{
    //
    // Our floating point number, f, is represented by the bit
    // pattern in integer i.  Disassemble that bit pattern into
    // the sign, s, the exponent, e, and the significand, m.
    // Shift s into the position where it will go in in the
    // resulting half number.
    // Adjust e, accounting for the different exponent bias
    // of float and half (127 versus 15).
    //

    int s =  (i >> 16) & 0x00008000;
    int e = ((i >> 23) & 0x000000ff) - (127 - 15);
    int m =   i        & 0x007fffff;

    //
    // Now reassemble s, e and m into a half:
    //

    if (e <= 0)
    {
	if (e < -10)
	{
	    //
	    // E is less than -10.  The absolute value of f is
	    // less than HALF_MIN (f may be a small normalized
	    // float, a denormalized float or a zero).
	    //
	    // We convert f to a half zero with the same sign as f.
	    //

	    return s;
	}

	//
	// E is between -10 and 0.  F is a normalized float
	// whose magnitude is less than HALF_NRM_MIN.
	//
	// We convert f to a denormalized half.
	//

	//
	// Add an explicit leading 1 to the significand.
	// 

	m = m | 0x00800000;

	//
	// Round to m to the nearest (10+e)-bit value (with e between
	// -10 and 0); in case of a tie, round to the nearest even value.
	//
	// Rounding may cause the significand to overflow and make
	// our number normalized.  Because of the way a half's bits
	// are laid out, we don't have to treat this case separately;
	// the code below will handle it correctly.
	// 

	int t = 14 - e;
	int a = (1 << (t - 1)) - 1;
	int b = (m >> t) & 1;

	m = (m + a + b) >> t;

	//
	// Assemble the half from s, e (zero) and m.
	//

	return s | m;
    }
    else if (e == 0xff - (127 - 15))
    {
	if (m == 0)
	{
	    //
	    // F is an infinity; convert f to a half
	    // infinity with the same sign as f.
	    //

	    return s | 0x7c00;
	}
	else
	{
	    //
	    // F is a NAN; we produce a half NAN that preserves
	    // the sign bit and the 10 leftmost bits of the
	    // significand of f, with one exception: If the 10
	    // leftmost bits are all zero, the NAN would turn 
	    // into an infinity, so we have to set at least one
	    // bit in the significand.
	    //

	    m >>= 13;
	    return s | 0x7c00 | m | (m == 0);
	}
    }
    else
    {
	//
	// E is greater than zero.  F is a normalized float.
	// We try to convert f to a normalized half.
	//

	//
	// Round to m to the nearest 10-bit value.  In case of
	// a tie, round to the nearest even value.
	//

	m = m + 0x00000fff + ((m >> 13) & 1);

	if (m & 0x00800000)
	{
	    m =  0;		// overflow in significand,
	    e += 1;		// adjust exponent
	}

	//
	// Handle exponent overflow
	//

	if (e > 30)
	{
	    overflow ();	// Cause a hardware floating point overflow;
	    return s | 0x7c00;	// if this returns, the half becomes an
	}   			// infinity with the same sign as f.

	//
	// Assemble the half from s, e and m.
	//

	return s | (e << 10) | (m >> 13);
    }
}